

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.cpp
# Opt level: O3

bool __thiscall slang::ast::ASTContext::requireIntegral(ASTContext *this,Expression *expr)

{
  bool bVar1;
  Diagnostic *diag;
  
  bVar1 = Expression::bad(expr);
  if (!bVar1) {
    bVar1 = Type::isIntegral((expr->type).ptr);
    if (bVar1) {
      return true;
    }
    diag = addDiag(this,(DiagCode)0x550007,expr->sourceRange);
    ast::operator<<(diag,(expr->type).ptr);
  }
  return false;
}

Assistant:

bool ASTContext::requireIntegral(const Expression& expr) const {
    if (expr.bad())
        return false;

    if (!expr.type->isIntegral()) {
        addDiag(diag::ExprMustBeIntegral, expr.sourceRange) << *expr.type;
        return false;
    }

    return true;
}